

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

ssize_t __thiscall
uWS::WebSocket<false>::send(WebSocket<false> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  Message *pMVar2;
  Message *extraout_RAX;
  uv_poll_t *puVar3;
  Message *extraout_RAX_00;
  Message *pMVar4;
  size_t sVar5;
  Message *extraout_RAX_01;
  undefined4 in_register_00000084;
  _func_void_void_ptr_void_ptr_bool_void_ptr *p_Var6;
  void *in_R9;
  Message *messagePtr_2;
  bool wasTransferred_1;
  Message *messagePtr_1;
  bool wasTransferred;
  Message *messagePtr;
  int memoryIndex;
  int memoryLength;
  int HEADER_LENGTH;
  Message *in_stack_ffffffffffffff68;
  Socket *in_stack_ffffffffffffff70;
  int index;
  NodeData *in_stack_ffffffffffffff78;
  NodeData *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 compressed;
  undefined8 in_stack_ffffffffffffff98;
  OpCode opCode;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  
  opCode = (OpCode)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  compressed = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  p_Var6 = (_func_void_void_ptr_void_ptr_bool_void_ptr *)CONCAT44(in_register_00000084,__flags);
  bVar1 = uS::Socket::hasEmptyQueue((Socket *)0x1357d9);
  if (bVar1) {
    if ((long)__buf + 0x3eU < 0x401) {
      uS::Socket::getSocketData(&this->super_Socket);
      index = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      uS::NodeData::getMemoryBlockIndex((long)((int)__buf + 0x3e));
      uS::Socket::getSocketData(&this->super_Socket);
      pMVar2 = (Message *)uS::NodeData::getSmallMemoryBlock(in_stack_ffffffffffffff78,index);
      pMVar2->data = (char *)(pMVar2 + 1);
      sVar5 = WebSocketProtocol<false>::formatMessage
                        ((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8,
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),opCode,
                         (size_t)this,(bool)compressed);
      pMVar2->length = sVar5;
      pMVar4 = (Message *)
               uS::Socket::write(&this->super_Socket,(int)pMVar2,&stack0xffffffffffffffb7,sVar5);
      if (((ulong)pMVar4 & 1) == 0) {
        if (p_Var6 != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
          puVar3 = uS::Socket::operator_cast_to_uv_poll_s_(&this->super_Socket);
          pMVar4 = (Message *)(*p_Var6)(puVar3,in_R9,true,(void *)0x0);
        }
      }
      else if ((in_stack_ffffffffffffffb7 & 1) == 0) {
        uS::Socket::getSocketData(&this->super_Socket);
        uS::NodeData::freeSmallMemoryBlock
                  (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,index);
        pMVar4 = extraout_RAX;
        if (p_Var6 != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
          puVar3 = uS::Socket::operator_cast_to_uv_poll_s_(&this->super_Socket);
          pMVar4 = (Message *)(*p_Var6)(puVar3,in_R9,false,(void *)0x0);
        }
      }
      else {
        pMVar2->callback = p_Var6;
        pMVar2->callbackData = in_R9;
        pMVar4 = pMVar2;
      }
    }
    else {
      pMVar4 = uS::Socket::allocMessage
                         ((Socket *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                          (char *)in_stack_ffffffffffffff70);
      sVar5 = WebSocketProtocol<false>::formatMessage
                        ((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         (char *)pMVar4,
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),opCode,
                         (size_t)this,(bool)compressed);
      pMVar4->length = sVar5;
      pMVar2 = (Message *)
               uS::Socket::write(&this->super_Socket,(int)pMVar4,&stack0xffffffffffffffa7,sVar5);
      if (((ulong)pMVar2 & 1) == 0) {
        pMVar4 = pMVar2;
        if (p_Var6 != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
          puVar3 = uS::Socket::operator_cast_to_uv_poll_s_(&this->super_Socket);
          pMVar4 = (Message *)(*p_Var6)(puVar3,in_R9,true,(void *)0x0);
        }
      }
      else if ((in_stack_ffffffffffffffa7 & 1) == 0) {
        uS::Socket::freeMessage(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        pMVar4 = extraout_RAX_00;
        if (p_Var6 != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
          puVar3 = uS::Socket::operator_cast_to_uv_poll_s_(&this->super_Socket);
          pMVar4 = (Message *)(*p_Var6)(puVar3,in_R9,false,(void *)0x0);
        }
      }
      else {
        pMVar4->callback = p_Var6;
        pMVar4->callbackData = in_R9;
      }
    }
  }
  else {
    pMVar4 = uS::Socket::allocMessage
                       ((Socket *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,
                        (char *)in_stack_ffffffffffffff70);
    sVar5 = WebSocketProtocol<false>::formatMessage
                      ((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,
                       CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       (OpCode)((ulong)pMVar4 >> 0x38),(size_t)this,(bool)compressed);
    pMVar4->length = sVar5;
    pMVar4->callback = p_Var6;
    pMVar4->callbackData = in_R9;
    uS::Socket::enqueue(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pMVar4 = extraout_RAX_01;
  }
  return (ssize_t)pMVar4;
}

Assistant:

void WebSocket<isServer>::send(const char *message, size_t length, OpCode opCode, void(*callback)(void *webSocket, void *data, bool cancelled, void *reserved), void *callbackData) {
    const int HEADER_LENGTH = WebSocketProtocol<!isServer>::LONG_MESSAGE_HEADER;

    if (hasEmptyQueue()) {
        if (length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH <= uS::NodeData::preAllocMaxSize) {
            int memoryLength = length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH;
            int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

            uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
            messagePtr->data = ((char *) messagePtr) + sizeof(uS::SocketData::Queue::Message);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);

            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        } else {
            uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    freeMessage(messagePtr);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        }
    } else {
        uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
        messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
        messagePtr->callback = callback;
        messagePtr->callbackData = callbackData;
        enqueue(messagePtr);
    }
}